

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  float fVar1;
  float local_a0;
  int local_9c;
  undefined1 local_98 [4];
  int i_2;
  Vector<float> v5;
  int local_7c;
  undefined1 local_78 [4];
  int i_1;
  Vector<double> v4;
  Vector<int> v3;
  Vector<int> v2;
  int local_38;
  int local_34;
  undefined1 local_30 [4];
  int i;
  Vector<int> v1;
  int N;
  char **argv_local;
  int argc_local;
  
  v1.values._4_4_ = 0;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&v1.values + 4));
  Vector<int>::Vector((Vector<int> *)local_30,v1.values._4_4_);
  for (local_34 = 0; local_34 < v1.values._4_4_; local_34 = local_34 + 1) {
    local_38 = 3;
    Vector<int>::set((Vector<int> *)local_30,local_34,&local_38);
  }
  Vector<int>::Vector((Vector<int> *)&v3.values,(Vector<int> *)local_30);
  Vector<int>::print((Vector<int> *)&v3.values);
  Vector<int>::Vector((Vector<int> *)&v4.values,v1.values._4_4_);
  print<int>((Vector<int> *)&v4.values);
  Vector<int>::operator=((Vector<int> *)&v4.values,(Vector<int> *)local_30);
  print<int>((Vector<int> *)&v4.values);
  Vector<double>::Vector((Vector<double> *)local_78,v1.values._4_4_);
  for (local_7c = 0; local_7c < v1.values._4_4_; local_7c = local_7c + 1) {
    v5.values = (float *)0x40091eb851eb851f;
    Vector<double>::set((Vector<double> *)local_78,local_7c,(double *)&v5.values);
  }
  print<double>((Vector<double> *)local_78);
  Vector<float>::Vector((Vector<float> *)local_98,v1.values._4_4_);
  for (local_9c = 0; local_9c < v1.values._4_4_; local_9c = local_9c + 1) {
    local_a0 = 3.14;
    Vector<float>::set((Vector<float> *)local_98,local_9c,&local_a0);
  }
  print<float>((Vector<float> *)local_98);
  fVar1 = Vector<float>::operator[]((Vector<float> *)local_98,0);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Vector<float>::~Vector((Vector<float> *)local_98);
  Vector<double>::~Vector((Vector<double> *)local_78);
  Vector<int>::~Vector((Vector<int> *)&v4.values);
  Vector<int>::~Vector((Vector<int> *)&v3.values);
  Vector<int>::~Vector((Vector<int> *)local_30);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    // There is a std::cin object meaning console input. Use it for reading an integer from console.
    //   { int N; std::cin >> N; } defines an integer, reads an integer from the keyboard and
    //   stores it in variable "N".
    auto N = 0;
    std::cin >> N;

    // Create an "N" dimensional vector by "IntVector v1(N)" or equivalently "auto v1 = IntVector(N)".
    // If, for instance, N is entered as 5, this creates an IntVector instance that can store 5 different integer values
    //   (use new operator for dynamic memory allocation).
    auto v1 = Vector<int>(N);

    // Use v1.set(...) method for N times via a for loop to
    //   initialize the IntVector instance's contents to 1, 2, ..., N respectively.
    for(int i=0; i<N; ++i)
        v1.set(i, 3.14);

    // Use copy-constructor by "auto v2 = IntVector(v1);"
    auto v2 = Vector<int>(v1);

    // Write v2's contents by "v2.print();" (The output shall be 1, 2, 3, ..., N)
    //   where N is the number entered from the keyboard at program's start.
    v2.print();

    // Create v3 by "auto v3 = IntVector(N);". Print it "v3.print();". Result is "0, 0, ..., 0"
    auto v3 = Vector<int>(N);
    print(v3);

    //"v3 = v1; v3.print();" Result shall be 1, 2, 3, ..., N if you did everything correctly.
    v3 = v1;
    print(v3);

    auto v4 = Vector<double>(N);
    for(int i=0; i<N; ++i)
        v4.set(i, 3.14);
    print(v4);

    auto v5 = Vector<float>(N);
    for(int i=0; i<N; ++i)
        v5.set(i, 3.14f);
    print(v5);

    std::cout << v5[0] << std::endl;

    return 0;
}